

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O3

void sb_qp_sweep_init_quantizers
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,
               SIMPLE_MOTION_DATA_TREE *sms_tree,RD_STATS *rd_cost,int mi_row,int mi_col,
               int delta_qp_ofs)

{
  BLOCK_SIZE bsize;
  uint8_t uVar1;
  MB_MODE_INFO *pMVar2;
  SequenceHeader *pSVar3;
  MB_RD_RECORD *pMVar4;
  int8_t iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  
  bsize = ((cpi->common).seq_params)->sb_size;
  iVar6 = (cpi->common).delta_q_info.delta_q_res;
  if ((((((cpi->sf).part_sf.simple_motion_search_split != 0) ||
        ((cpi->sf).part_sf.simple_motion_search_prune_rect != 0)) ||
       ((cpi->sf).part_sf.simple_motion_search_early_term_none != 0)) ||
      ((cpi->sf).part_sf.ml_early_term_after_part_split_level != 0)) &&
     (((cpi->common).current_frame.frame_type & 0xfd) != 0)) {
    av1_init_simple_motion_search_mvs_for_sb
              (cpi,&tile_data->tile_info,&td->mb,sms_tree,mi_row,mi_col);
  }
  iVar6 = av1_adjust_q_from_delta_q_res
                    (iVar6,(td->mb).e_mbd.current_base_qindex,
                     delta_qp_ofs + (td->mb).rdmult_cur_qindex);
  (td->mb).delta_qindex = iVar6 - (cpi->common).quant_params.base_qindex;
  av1_set_offsets(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,bsize);
  pMVar2 = *(td->mb).e_mbd.mi;
  pMVar2->current_qindex = iVar6;
  av1_init_plane_quantizers(cpi,&td->mb,*(ushort *)&pMVar2->field_0xa7 & 7,0);
  iVar6 = (td->mb).delta_qindex;
  td->deltaq_used = td->deltaq_used | (uint)(iVar6 != 0);
  if ((cpi->oxcf).tool_cfg.enable_deltalf_mode == true) {
    iVar16 = (cpi->common).delta_q_info.delta_lf_res;
    iVar11 = iVar6 + 3;
    if (-1 < iVar6) {
      iVar11 = iVar6;
    }
    uVar7 = iVar16 / 2 + (iVar11 >> 2) & -iVar16;
    uVar8 = 0x3f;
    if ((int)uVar7 < 0x3f) {
      uVar8 = uVar7;
    }
    iVar5 = -0x3f;
    if (-0x3f < (int)uVar8) {
      iVar5 = (int8_t)uVar8;
    }
    pSVar3 = (cpi->common).seq_params;
    iVar6 = pSVar3->mib_size;
    iVar16 = (cpi->common).mi_params.mi_rows;
    iVar11 = iVar16 - mi_row;
    if (iVar6 < iVar16 - mi_row) {
      iVar11 = iVar6;
    }
    if (0 < iVar11) {
      uVar1 = pSVar3->monochrome;
      iVar11 = (cpi->common).mi_params.mi_cols;
      iVar12 = 0;
      iVar13 = mi_row;
      do {
        iVar15 = iVar11 - mi_col;
        if (iVar6 < iVar11 - mi_col) {
          iVar15 = iVar6;
        }
        if (0 < iVar15) {
          iVar16 = 0;
          lVar9 = (long)mi_col;
          do {
            iVar11 = (cpi->common).mi_params.mi_stride;
            (cpi->common).mi_params.mi_alloc[iVar11 * (iVar12 + mi_row) + iVar16 + mi_col].
            delta_lf_from_base = iVar5;
            lVar14 = (iVar11 * iVar13 + lVar9) * 0xb0 + 0xa3;
            lVar10 = (ulong)(uVar1 == '\0') * 2 + 2;
            do {
              *(int8_t *)((long)((cpi->common).mi_params.mi_alloc)->mv + lVar14 + -8) = iVar5;
              lVar14 = lVar14 + 1;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
            iVar16 = iVar16 + 1;
            iVar11 = (cpi->common).mi_params.mi_cols;
            iVar15 = iVar11 - mi_col;
            if (iVar6 < iVar11 - mi_col) {
              iVar15 = iVar6;
            }
            lVar9 = lVar9 + 1;
          } while (iVar16 < iVar15);
          iVar16 = (cpi->common).mi_params.mi_rows;
        }
        iVar12 = iVar12 + 1;
        iVar15 = iVar16 - mi_row;
        if (iVar6 < iVar16 - mi_row) {
          iVar15 = iVar6;
        }
        iVar13 = iVar13 + 1;
      } while (iVar12 < iVar15);
    }
  }
  (td->mb).reuse_inter_pred = false;
  (td->mb).txfm_search_params.mode_eval_type = 0;
  pMVar4 = (td->mb).txfm_search_info.mb_rd_record;
  if (pMVar4 != (MB_RD_RECORD *)0x0) {
    pMVar4->index_start = 0;
    pMVar4->num = 0;
  }
  memset((td->mb).picked_ref_frames_mask,0,0x1000);
  rd_cost->rate = 0x7fffffff;
  rd_cost->zero_rate = 0;
  rd_cost->dist = 0x7fffffffffffffff;
  rd_cost->rdcost = 0x7fffffffffffffff;
  rd_cost->sse = 0x7fffffffffffffff;
  rd_cost->skip_txfm = '\0';
  return;
}

Assistant:

static void sb_qp_sweep_init_quantizers(AV1_COMP *cpi, ThreadData *td,
                                        const TileDataEnc *tile_data,
                                        SIMPLE_MOTION_DATA_TREE *sms_tree,
                                        RD_STATS *rd_cost, int mi_row,
                                        int mi_col, int delta_qp_ofs) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = &td->mb;
  const BLOCK_SIZE sb_size = cm->seq_params->sb_size;
  const TileInfo *tile_info = &tile_data->tile_info;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const DeltaQInfo *const delta_q_info = &cm->delta_q_info;
  assert(delta_q_info->delta_q_present_flag);
  const int delta_q_res = delta_q_info->delta_q_res;

  const SPEED_FEATURES *sf = &cpi->sf;
  const int use_simple_motion_search =
      (sf->part_sf.simple_motion_search_split ||
       sf->part_sf.simple_motion_search_prune_rect ||
       sf->part_sf.simple_motion_search_early_term_none ||
       sf->part_sf.ml_early_term_after_part_split_level) &&
      !frame_is_intra_only(cm);
  if (use_simple_motion_search) {
    av1_init_simple_motion_search_mvs_for_sb(cpi, tile_info, x, sms_tree,
                                             mi_row, mi_col);
  }

  int current_qindex = x->rdmult_cur_qindex + delta_qp_ofs;

  MACROBLOCKD *const xd = &x->e_mbd;
  current_qindex = av1_adjust_q_from_delta_q_res(
      delta_q_res, xd->current_base_qindex, current_qindex);

  x->delta_qindex = current_qindex - cm->quant_params.base_qindex;

  av1_set_offsets(cpi, tile_info, x, mi_row, mi_col, sb_size);
  xd->mi[0]->current_qindex = current_qindex;
  av1_init_plane_quantizers(cpi, x, xd->mi[0]->segment_id, 0);

  // keep track of any non-zero delta-q used
  td->deltaq_used |= (x->delta_qindex != 0);

  if (cpi->oxcf.tool_cfg.enable_deltalf_mode) {
    const int delta_lf_res = delta_q_info->delta_lf_res;
    const int lfmask = ~(delta_lf_res - 1);
    const int delta_lf_from_base =
        ((x->delta_qindex / 4 + delta_lf_res / 2) & lfmask);
    const int8_t delta_lf =
        (int8_t)clamp(delta_lf_from_base, -MAX_LOOP_FILTER, MAX_LOOP_FILTER);
    const int frame_lf_count =
        av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
    const int mib_size = cm->seq_params->mib_size;

    // pre-set the delta lf for loop filter. Note that this value is set
    // before mi is assigned for each block in current superblock
    for (int j = 0; j < AOMMIN(mib_size, mi_params->mi_rows - mi_row); j++) {
      for (int k = 0; k < AOMMIN(mib_size, mi_params->mi_cols - mi_col); k++) {
        const int grid_idx = get_mi_grid_idx(mi_params, mi_row + j, mi_col + k);
        mi_params->mi_alloc[grid_idx].delta_lf_from_base = delta_lf;
        for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
          mi_params->mi_alloc[grid_idx].delta_lf[lf_id] = delta_lf;
        }
      }
    }
  }

  x->reuse_inter_pred = false;
  x->txfm_search_params.mode_eval_type = DEFAULT_EVAL;
  reset_mb_rd_record(x->txfm_search_info.mb_rd_record);
  av1_zero(x->picked_ref_frames_mask);
  av1_invalid_rd_stats(rd_cost);
}